

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O1

void __thiscall booster::locale::date_time::date_time(date_time *this,date_time_period_set *s)

{
  uint uVar1;
  calendar_facet *pcVar2;
  abstract_calendar *paVar3;
  size_t sVar4;
  date_time_period *pdVar5;
  uint uVar6;
  ulong n;
  locale local_48 [2];
  _Impl local_38 [16];
  
  std::locale::locale(local_48);
  pcVar2 = std::use_facet<booster::locale::calendar_facet>(local_48);
  paVar3 = (abstract_calendar *)(**(code **)(*(long *)pcVar2 + 0x10))(pcVar2);
  (this->impl_).ptr_ = paVar3;
  std::locale::~locale(local_48);
  paVar3 = (this->impl_).ptr_;
  time_zone::global_abi_cxx11_();
  (*paVar3->_vptr_abstract_calendar[10])(paVar3,local_48);
  if (local_48[0]._M_impl != local_38) {
    operator_delete(local_48[0]._M_impl);
  }
  uVar6 = 0;
  while( true ) {
    sVar4 = date_time_period_set::size(s);
    n = (ulong)uVar6;
    paVar3 = (this->impl_).ptr_;
    if (sVar4 <= n) break;
    pdVar5 = date_time_period_set::operator[](s,n);
    uVar1 = *(uint *)pdVar5;
    pdVar5 = date_time_period_set::operator[](s,n);
    (*paVar3->_vptr_abstract_calendar[1])(paVar3,(ulong)uVar1,(ulong)*(uint *)(pdVar5 + 4));
    uVar6 = uVar6 + 1;
  }
  (*paVar3->_vptr_abstract_calendar[2])(paVar3);
  return;
}

Assistant:

date_time::date_time(date_time_period_set const &s) :
    impl_(std::use_facet<calendar_facet>(std::locale()).create_calendar())
{
    impl_->set_timezone(time_zone::global());
    for(unsigned i=0;i<s.size();i++) {
        impl_->set_value(s[i].type.mark(),s[i].value);
    }
    impl_->normalize();
}